

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

void duckdb::RadixSortMSD
               (data_ptr_t orig_ptr,data_ptr_t temp_ptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *comp_width,idx_t *offset,idx_t *locations,bool swap)

{
  idx_t iVar1;
  idx_t iVar2;
  ulong uVar3;
  data_ptr_t pdVar4;
  byte *pbVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  data_ptr_t row_ptr;
  data_ptr_t src;
  ulong uVar10;
  idx_t local_68;
  idx_t *local_60;
  idx_t *local_58;
  idx_t local_50;
  data_ptr_t local_48;
  size_t *local_40;
  ulong *local_38;
  
  local_48 = temp_ptr;
  src = orig_ptr;
  if (swap) {
    local_48 = orig_ptr;
    src = temp_ptr;
  }
  switchD_01306cb1::default(locations,0,0x808);
  pdVar4 = local_48;
  local_58 = offset;
  iVar1 = *offset;
  iVar2 = *col_offset;
  if (*count != 0) {
    pbVar5 = src + iVar1 + iVar2;
    uVar7 = 0;
    do {
      locations[(ulong)*pbVar5 + 1] = locations[(ulong)*pbVar5 + 1] + 1;
      pbVar5 = pbVar5 + *row_width;
      uVar7 = uVar7 + 1;
    } while (uVar7 < *count);
  }
  iVar6 = *locations;
  lVar8 = 1;
  uVar7 = 0;
  do {
    uVar10 = locations[lVar8];
    if (uVar7 <= uVar10) {
      uVar7 = uVar10;
    }
    iVar6 = iVar6 + uVar10;
    locations[lVar8] = iVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x101);
  local_60 = col_offset;
  if (uVar7 != *count) {
    if (*count != 0) {
      uVar10 = 0;
      local_38 = locations;
      local_40 = row_width;
      do {
        uVar3 = local_38[src[iVar1 + iVar2]];
        local_38[src[iVar1 + iVar2]] = uVar3 + 1;
        FastMemcpy(pdVar4 + uVar3 * *local_40,src,*local_40);
        src = src + *local_40;
        uVar10 = uVar10 + 1;
        row_width = local_40;
        locations = local_38;
      } while (uVar10 < *count);
    }
    swap = !swap;
  }
  if (*local_58 == *comp_width - 1) {
    if (swap != false) {
      switchD_012dd528::default(orig_ptr,temp_ptr,*row_width * *count);
      return;
    }
  }
  else if (uVar7 == *count) {
    local_68 = *local_58 + 1;
    RadixSortMSD(orig_ptr,temp_ptr,count,local_60,row_width,comp_width,&local_68,locations + 0x101,
                 swap);
  }
  else {
    local_68 = *locations;
    lVar8 = 0;
    do {
      lVar9 = (locations[lVar8] - local_68) * *row_width;
      if (local_68 < 0x19) {
        if (local_68 != 0) {
          local_50 = *local_58 + 1;
          InsertionSort(orig_ptr + lVar9,temp_ptr + lVar9,&local_68,local_60,row_width,comp_width,
                        &local_50,swap);
        }
      }
      else {
        local_50 = *local_58 + 1;
        RadixSortMSD(orig_ptr + lVar9,temp_ptr + lVar9,&local_68,local_60,row_width,comp_width,
                     &local_50,locations + 0x101,swap);
      }
      local_68 = locations[lVar8 + 1] - locations[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  return;
}

Assistant:

void RadixSortMSD(const data_ptr_t orig_ptr, const data_ptr_t temp_ptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &comp_width, const idx_t &offset, idx_t locations[], bool swap) {
	const data_ptr_t source_ptr = swap ? temp_ptr : orig_ptr;
	const data_ptr_t target_ptr = swap ? orig_ptr : temp_ptr;
	// Init counts to 0
	memset(locations, 0, SortConstants::MSD_RADIX_LOCATIONS * sizeof(idx_t));
	idx_t *counts = locations + 1;
	// Collect counts
	const idx_t total_offset = col_offset + offset;
	data_ptr_t offset_ptr = source_ptr + total_offset;
	for (idx_t i = 0; i < count; i++) {
		counts[*offset_ptr]++;
		offset_ptr += row_width;
	}
	// Compute locations from counts
	idx_t max_count = 0;
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		max_count = MaxValue<idx_t>(max_count, counts[radix]);
		counts[radix] += locations[radix];
	}
	if (max_count != count) {
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr;
		for (idx_t i = 0; i < count; i++) {
			const idx_t &radix_offset = locations[*(row_ptr + total_offset)]++;
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr += row_width;
		}
		swap = !swap;
	}
	// Check if done
	if (offset == comp_width - 1) {
		if (swap) {
			memcpy(orig_ptr, temp_ptr, count * row_width);
		}
		return;
	}
	if (max_count == count) {
		RadixSortMSD(orig_ptr, temp_ptr, count, col_offset, row_width, comp_width, offset + 1,
		             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		return;
	}
	// Recurse
	idx_t radix_count = locations[0];
	for (idx_t radix = 0; radix < SortConstants::VALUES_PER_RADIX; radix++) {
		const idx_t loc = (locations[radix] - radix_count) * row_width;
		if (radix_count > SortConstants::INSERTION_SORT_THRESHOLD) {
			RadixSortMSD(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			             locations + SortConstants::MSD_RADIX_LOCATIONS, swap);
		} else if (radix_count != 0) {
			InsertionSort(orig_ptr + loc, temp_ptr + loc, radix_count, col_offset, row_width, comp_width, offset + 1,
			              swap);
		}
		radix_count = locations[radix + 1] - locations[radix];
	}
}